

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_RelaxDeltaE(ARKodeMem ark_mem,ARKRelaxJacFn relax_jac_fn,long *num_relax_jac_evals,
                       sunrealtype *delta_e_out)

{
  N_Vector p_Var1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  double *in_RCX;
  long *in_RDX;
  code *in_RSI;
  ARKodeMem in_RDI;
  double dVar6;
  sunrealtype bi;
  N_Vector rhs_tmp;
  N_Vector J_relax;
  N_Vector z_stage;
  ARKodeARKStepMem step_mem;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  int retval;
  int nvec;
  int j;
  int i;
  double local_70;
  N_Vector local_68;
  N_Vector local_58;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_58 = in_RDI->tempv2;
  p_Var1 = in_RDI->tempv3;
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0xd76,"arkStep_RelaxDeltaE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    pvVar2 = in_RDI->step_mem;
    *in_RCX = 0.0;
    puVar3 = *(undefined8 **)((long)pvVar2 + 0x1a8);
    puVar4 = *(undefined8 **)((long)pvVar2 + 0x1b0);
    for (local_2c = 0; local_2c < *(int *)((long)pvVar2 + 100); local_2c = local_2c + 1) {
      if ((*(int *)((long)pvVar2 + 0x20) == 0) && (*(int *)((long)pvVar2 + 0x178) != 1)) {
        *puVar3 = 0x3ff0000000000000;
        *puVar4 = in_RDI->yn;
        local_34 = 1;
        for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
          puVar3[local_34] =
               in_RDI->h *
               *(double *)
                (*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x10) + (long)local_2c * 8) +
                (long)local_30 * 8);
          puVar4[local_34] = *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + (long)local_30 * 8);
          local_34 = local_34 + 1;
        }
        iVar5 = N_VLinearCombination(local_34,puVar3,puVar4,local_58);
        if (iVar5 != 0) {
          return -0x1c;
        }
      }
      else {
        local_58 = *(N_Vector *)(*(long *)((long)pvVar2 + 0x38) + (long)local_2c * 8);
      }
      iVar5 = (*in_RSI)(local_58,p_Var1,in_RDI->user_data);
      *in_RDX = *in_RDX + 1;
      if (iVar5 < 0) {
        return -0x2e;
      }
      if (0 < iVar5) {
        return 2;
      }
      local_68 = local_58;
      if ((*(int *)((long)pvVar2 + 0x1c) == 0) || (*(int *)((long)pvVar2 + 0x20) == 0)) {
        if (*(int *)((long)pvVar2 + 0x1c) == 0) {
          if (*(int *)((long)pvVar2 + 0x178) == 1) {
            N_VScale(0x3ff0000000000000,
                     *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + (long)local_2c * 8),local_58);
          }
          else {
            local_68 = *(N_Vector *)(*(long *)((long)pvVar2 + 0x30) + (long)local_2c * 8);
          }
          local_70 = *(double *)
                      (*(long *)(*(long *)((long)pvVar2 + 0x70) + 0x20) + (long)local_2c * 8);
        }
        else {
          if (*(int *)((long)pvVar2 + 0x178) == 1) {
            N_VScale(0x3ff0000000000000,
                     *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + (long)local_2c * 8),local_58);
          }
          else {
            local_68 = *(N_Vector *)(*(long *)((long)pvVar2 + 0x28) + (long)local_2c * 8);
          }
          local_70 = *(double *)
                      (*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x20) + (long)local_2c * 8);
        }
      }
      else {
        N_VLinearSum(*(undefined8 *)
                      (*(long *)(*(long *)((long)pvVar2 + 0x68) + 0x20) + (long)local_2c * 8),
                     *(undefined8 *)
                      (*(long *)(*(long *)((long)pvVar2 + 0x70) + 0x20) + (long)local_2c * 8),
                     *(undefined8 *)(*(long *)((long)pvVar2 + 0x28) + (long)local_2c * 8),
                     *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + (long)local_2c * 8),local_58);
        local_70 = 1.0;
      }
      if ((*(int *)((long)pvVar2 + 0x178) == 1) &&
         (iVar5 = (**(code **)((long)pvVar2 + 0x160))
                            (*(undefined8 *)((long)pvVar2 + 0xe8),in_RDI,local_68), iVar5 != 0)) {
        return -0x10;
      }
      if ((p_Var1->ops->nvdotprodlocal == (_func_sunrealtype_N_Vector_N_Vector *)0x0) ||
         (p_Var1->ops->nvdotprodmultiallreduce ==
          (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0)) {
        dVar6 = (double)N_VDotProd(p_Var1,local_68);
        *in_RCX = local_70 * dVar6 + *in_RCX;
      }
      else {
        dVar6 = (double)N_VDotProdLocal(p_Var1,local_68);
        *in_RCX = local_70 * dVar6 + *in_RCX;
      }
    }
    if (((p_Var1->ops->nvdotprodlocal == (_func_sunrealtype_N_Vector_N_Vector *)0x0) ||
        (p_Var1->ops->nvdotprodmultiallreduce ==
         (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0)) ||
       (iVar5 = N_VDotProdMultiAllReduce(1,p_Var1,in_RCX), iVar5 == 0)) {
      *in_RCX = in_RDI->h * *in_RCX;
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int arkStep_RelaxDeltaE(ARKodeMem ark_mem, ARKRelaxJacFn relax_jac_fn,
                        long int* num_relax_jac_evals, sunrealtype* delta_e_out)
{
  int i, j, nvec, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;
  N_Vector z_stage = ark_mem->tempv2;
  N_Vector J_relax = ark_mem->tempv3;
  N_Vector rhs_tmp = NULL;
  sunrealtype bi   = ONE;

  /* Access the stepper memory structure */
  if (!(ark_mem->step_mem))
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return ARK_MEM_NULL;
  }
  step_mem = (ARKodeARKStepMem)(ark_mem->step_mem);

  /* Initialize output */
  *delta_e_out = ZERO;

  /* Set arrays for fused vector operation */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  for (i = 0; i < step_mem->stages; i++)
  {
    if (step_mem->implicit || step_mem->mass_type == MASS_FIXED)
    {
      /* Use stored stages */
      z_stage = step_mem->z[i];
    }
    else
    {
      /* Reconstruct explicit stages */
      nvec = 0;

      cvals[nvec] = ONE;
      Xvecs[nvec] = ark_mem->yn;
      nvec++;

      for (j = 0; j < i; j++)
      {
        cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec++;
      }

      retval = N_VLinearCombination(nvec, cvals, Xvecs, z_stage);
      if (retval) { return ARK_VECTOROP_ERR; }
    }

    /* Evaluate the Jacobian at z_i */
    retval = relax_jac_fn(z_stage, J_relax, ark_mem->user_data);
    (*num_relax_jac_evals)++;
    if (retval < 0) { return ARK_RELAX_JAC_FAIL; }
    if (retval > 0) { return ARK_RELAX_JAC_RECV; }

    /* Reset temporary RHS alias */
    rhs_tmp = z_stage;

    /* Compute delta_e = h * sum_i b_i * <relax_jac(z_i), f_i> */
    if (step_mem->explicit && step_mem->implicit)
    {
      N_VLinearSum(step_mem->Be->b[i], step_mem->Fe[i], step_mem->Bi->b[i],
                   step_mem->Fi[i], rhs_tmp);
      bi = ONE;
    }
    else if (step_mem->explicit)
    {
      if (step_mem->mass_type == MASS_FIXED)
      {
        N_VScale(ONE, step_mem->Fe[i], rhs_tmp);
      }
      else { rhs_tmp = step_mem->Fe[i]; }
      bi = step_mem->Be->b[i];
    }
    else
    {
      if (step_mem->mass_type == MASS_FIXED)
      {
        N_VScale(ONE, step_mem->Fi[i], rhs_tmp);
      }
      else { rhs_tmp = step_mem->Fi[i]; }
      bi = step_mem->Bi->b[i];
    }

    if (step_mem->mass_type == MASS_FIXED)
    {
      retval = step_mem->msolve((void*)ark_mem, rhs_tmp, step_mem->nlscoef);
      if (retval) { return ARK_MASSSOLVE_FAIL; }
    }

    /* Update estimate of relaxation function change */
    if (J_relax->ops->nvdotprodlocal && J_relax->ops->nvdotprodmultiallreduce)
    {
      *delta_e_out += bi * N_VDotProdLocal(J_relax, rhs_tmp);
    }
    else { *delta_e_out += bi * N_VDotProd(J_relax, rhs_tmp); }
  }

  if (J_relax->ops->nvdotprodlocal && J_relax->ops->nvdotprodmultiallreduce)
  {
    retval = N_VDotProdMultiAllReduce(1, J_relax, delta_e_out);
    if (retval) { return ARK_VECTOROP_ERR; }
  }

  *delta_e_out *= ark_mem->h;

  return ARK_SUCCESS;
}